

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::benchmarkEnded
          (XmlReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
          *benchmarkStats)

{
  XmlWriter *pXVar1;
  XmlWriter *this_00;
  allocator<char> local_f5;
  allocator<char> local_f4;
  allocator<char> local_f3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  string local_f0;
  rep_conflict local_d0;
  string local_c8;
  rep_conflict local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"mean",&local_f2);
  this_00 = &this->m_xml;
  XmlWriter::startElement(this_00,&local_60,Newline|Indent);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"value",&local_f3);
  local_40._M_dataplus._M_p = (pointer)(benchmarkStats->mean).point.__r;
  pXVar1 = XmlWriter::writeAttribute<double>(this_00,&local_80,(double *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"lowerBound",&local_f4);
  local_a8 = (benchmarkStats->mean).lower_bound.__r;
  pXVar1 = XmlWriter::writeAttribute<double>(pXVar1,&local_a0,&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"upperBound",&local_f5);
  local_d0 = (benchmarkStats->mean).upper_bound.__r;
  pXVar1 = XmlWriter::writeAttribute<double>(pXVar1,&local_c8,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"ci",&local_f1);
  XmlWriter::writeAttribute<double>(pXVar1,&local_f0,&(benchmarkStats->mean).confidence_interval);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  XmlWriter::endElement(this_00,Newline|Indent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"standardDeviation",&local_f2);
  XmlWriter::startElement(this_00,&local_60,Newline|Indent);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"value",&local_f3);
  local_40._M_dataplus._M_p = (pointer)(benchmarkStats->standardDeviation).point.__r;
  pXVar1 = XmlWriter::writeAttribute<double>(this_00,&local_80,(double *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"lowerBound",&local_f4);
  local_a8 = (benchmarkStats->standardDeviation).lower_bound.__r;
  pXVar1 = XmlWriter::writeAttribute<double>(pXVar1,&local_a0,&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"upperBound",&local_f5);
  local_d0 = (benchmarkStats->standardDeviation).upper_bound.__r;
  pXVar1 = XmlWriter::writeAttribute<double>(pXVar1,&local_c8,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"ci",&local_f1);
  XmlWriter::writeAttribute<double>
            (pXVar1,&local_f0,&(benchmarkStats->standardDeviation).confidence_interval);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  XmlWriter::endElement(this_00,Newline|Indent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"outliers",(allocator<char> *)&local_a8);
  XmlWriter::startElement(this_00,&local_60,Newline|Indent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"variance",(allocator<char> *)&local_d0);
  pXVar1 = XmlWriter::writeAttribute<double>(this_00,&local_80,&benchmarkStats->outlierVariance);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"lowMild",&local_f2);
  pXVar1 = XmlWriter::writeAttribute<int>(pXVar1,&local_a0,&(benchmarkStats->outliers).low_mild);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"lowSevere",&local_f3);
  pXVar1 = XmlWriter::writeAttribute<int>(pXVar1,&local_c8,&(benchmarkStats->outliers).low_severe);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"highMild",&local_f4);
  pXVar1 = XmlWriter::writeAttribute<int>(pXVar1,&local_f0,&(benchmarkStats->outliers).high_mild);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"highSevere",&local_f5);
  XmlWriter::writeAttribute<int>(pXVar1,&local_40,&(benchmarkStats->outliers).high_severe);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  XmlWriter::endElement(this_00,Newline|Indent);
  XmlWriter::endElement(this_00,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::benchmarkEnded(BenchmarkStats<> const &benchmarkStats) {
        m_xml.startElement("mean")
            .writeAttribute("value", benchmarkStats.mean.point.count())
            .writeAttribute("lowerBound", benchmarkStats.mean.lower_bound.count())
            .writeAttribute("upperBound", benchmarkStats.mean.upper_bound.count())
            .writeAttribute("ci", benchmarkStats.mean.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("standardDeviation")
            .writeAttribute("value", benchmarkStats.standardDeviation.point.count())
            .writeAttribute("lowerBound", benchmarkStats.standardDeviation.lower_bound.count())
            .writeAttribute("upperBound", benchmarkStats.standardDeviation.upper_bound.count())
            .writeAttribute("ci", benchmarkStats.standardDeviation.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("outliers")
            .writeAttribute("variance", benchmarkStats.outlierVariance)
            .writeAttribute("lowMild", benchmarkStats.outliers.low_mild)
            .writeAttribute("lowSevere", benchmarkStats.outliers.low_severe)
            .writeAttribute("highMild", benchmarkStats.outliers.high_mild)
            .writeAttribute("highSevere", benchmarkStats.outliers.high_severe);
        m_xml.endElement();
        m_xml.endElement();
    }